

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerPosixPipeConnection.cxx
# Opt level: O2

void __thiscall
cmDebugger::cmDebuggerPipeConnection_POSIX::write(cmDebuggerPipeConnection_POSIX *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  write((cmDebuggerPipeConnection_POSIX *)&this[-1].listen_fd,in_ESI,in_RDX,in_RCX);
  return;
}

Assistant:

bool cmDebuggerPipeConnection_POSIX::write(void const* buffer, size_t n)
{
  bool result = false;
  if (rw_pipe >= 0) {
    result = ::write(rw_pipe, buffer, n) >= 0;
    if (!result) {
      close();
    }
  }

  return result;
}